

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_case.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::caseMap
          (UnicodeString *this,int32_t caseLocale,uint32_t options,BreakIterator *iter,
          UStringCaseMapper *stringCaseMapper)

{
  bool bVar1;
  UStringCaseMapper *pUVar2;
  UBool UVar3;
  UErrorCode count;
  int32_t iVar4;
  int32_t length;
  int32_t srcStart;
  int32_t srcLength;
  char16_t *pcVar5;
  int32_t *local_3e8;
  int32_t *bufferToDelete;
  Iterator ei;
  char16_t local_3a8 [4];
  UChar replacementChars [200];
  undefined1 local_210 [8];
  Edits edits;
  int32_t local_118;
  int32_t capacity;
  char16_t *local_108;
  UChar *buffer;
  UnicodeString oldString;
  UErrorCode errorCode;
  UBool writable;
  int32_t newLength;
  int32_t oldLength;
  UChar *oldArray;
  UChar oldBuffer [54];
  UStringCaseMapper *stringCaseMapper_local;
  BreakIterator *iter_local;
  uint32_t options_local;
  int32_t caseLocale_local;
  UnicodeString *this_local;
  
  unique0x100006d8 = stringCaseMapper;
  UVar3 = isEmpty(this);
  if (UVar3 != '\0') {
    return this;
  }
  UVar3 = isWritable(this);
  if (UVar3 == '\0') {
    return this;
  }
  count = UnicodeString::length(this);
  oldString.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = isBufferWritable(this);
  oldString.fUnion._48_4_ = 0;
  UnicodeString((UnicodeString *)&buffer);
  if (oldString.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0') {
    if (count < U_INVALID_STATE_ERROR) goto LAB_00393190;
LAB_003933dd:
    _newLength = (UChar **)getArrayStart(this);
    Edits::Edits((Edits *)local_210);
    if (iter != (BreakIterator *)0x0) {
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&ei.destIndex,(char16_t *)_newLength);
      setTo((UnicodeString *)&buffer,'\0',(ConstChar16Ptr *)&ei.destIndex,count);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&ei.destIndex);
      (*(iter->super_UObject)._vptr_UObject[7])(iter,&buffer);
    }
    (*stack0xffffffffffffffc8)
              (caseLocale,options | 0x4000,iter,local_3a8,200,(char16_t *)_newLength,count,
               (Edits *)local_210,(UErrorCode *)(oldString.fUnion.fStackFields.fBuffer + 0x17));
    UVar3 = ::U_SUCCESS(oldString.fUnion._48_4_);
    if (UVar3 == '\0') {
      if (oldString.fUnion._48_4_ == 0xf) {
        iVar4 = Edits::lengthDelta((Edits *)local_210);
        errorCode = count + iVar4;
        bVar1 = false;
      }
      else {
        setToBogus(this);
        bVar1 = true;
        this_local = this;
      }
    }
    else {
      iVar4 = Edits::lengthDelta((Edits *)local_210);
      errorCode = count + iVar4;
      if ((count < errorCode) &&
         (UVar3 = cloneArrayIfNeeded(this,errorCode,errorCode,'\x01',(int32_t **)0x0,'\0'),
         UVar3 == '\0')) {
        bVar1 = true;
        this_local = this;
      }
      else {
        Edits::getCoarseChangesIterator((Iterator *)&bufferToDelete,(Edits *)local_210);
        while (UVar3 = Edits::Iterator::next
                                 ((Iterator *)&bufferToDelete,
                                  (UErrorCode *)(oldString.fUnion.fStackFields.fBuffer + 0x17)),
              UVar3 != '\0') {
          iVar4 = Edits::Iterator::destinationIndex((Iterator *)&bufferToDelete);
          length = Edits::Iterator::oldLength((Iterator *)&bufferToDelete);
          srcStart = Edits::Iterator::replacementIndex((Iterator *)&bufferToDelete);
          srcLength = Edits::Iterator::newLength((Iterator *)&bufferToDelete);
          doReplace(this,iVar4,length,local_3a8,srcStart,srcLength);
        }
        UVar3 = ::U_FAILURE(oldString.fUnion._48_4_);
        if (UVar3 != '\0') {
          setToBogus(this);
        }
        bVar1 = true;
        this_local = this;
      }
    }
    Edits::~Edits((Edits *)local_210);
    if (bVar1) goto LAB_003938e7;
  }
  else {
    if (0x36 < count) goto LAB_003933dd;
LAB_00393190:
    local_108 = getArrayStart(this);
    _newLength = &oldArray;
    u_memcpy_63((UChar *)_newLength,local_108,count);
    if (oldString.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0') {
      UVar3 = cloneArrayIfNeeded(this,0x1b,0x1b,'\0',(int32_t **)0x0,'\0');
      this_local = this;
      if (UVar3 == '\0') goto LAB_003938e7;
      local_108 = (this->fUnion).fStackFields.fBuffer;
      local_118 = 0x1b;
    }
    else {
      local_118 = getCapacity(this);
    }
    if (iter != (BreakIterator *)0x0) {
      ConstChar16Ptr::ConstChar16Ptr
                ((ConstChar16Ptr *)(edits.stackArray + 0x62),(char16_t *)_newLength);
      setTo((UnicodeString *)&buffer,'\0',(ConstChar16Ptr *)(edits.stackArray + 0x62),count);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)(edits.stackArray + 0x62));
      (*(iter->super_UObject)._vptr_UObject[7])(iter,&buffer);
    }
    errorCode = (*stack0xffffffffffffffc8)
                          (caseLocale,options,iter,local_108,local_118,(char16_t *)_newLength,count,
                           (Edits *)0x0,(UErrorCode *)(oldString.fUnion.fStackFields.fBuffer + 0x17)
                          );
    UVar3 = ::U_SUCCESS(oldString.fUnion._48_4_);
    if (UVar3 != '\0') {
      setLength(this,errorCode);
      this_local = this;
      goto LAB_003938e7;
    }
    if (oldString.fUnion._48_4_ != 0xf) {
      setToBogus(this);
      this_local = this;
      goto LAB_003938e7;
    }
  }
  local_3e8 = (int32_t *)0x0;
  UVar3 = cloneArrayIfNeeded(this,errorCode,errorCode,'\0',&local_3e8,'\x01');
  pUVar2 = stack0xffffffffffffffc8;
  this_local = this;
  if (UVar3 != '\0') {
    oldString.fUnion._48_4_ = 0;
    pcVar5 = getArrayStart(this);
    iVar4 = getCapacity(this);
    iVar4 = (*pUVar2)(caseLocale,options,iter,pcVar5,iVar4,(char16_t *)_newLength,count,(Edits *)0x0
                      ,(UErrorCode *)(oldString.fUnion.fStackFields.fBuffer + 0x17));
    if (local_3e8 != (int32_t *)0x0) {
      uprv_free_63(local_3e8);
    }
    UVar3 = ::U_SUCCESS(oldString.fUnion._48_4_);
    if (UVar3 == '\0') {
      setToBogus(this);
    }
    else {
      setLength(this,iVar4);
    }
  }
LAB_003938e7:
  ~UnicodeString((UnicodeString *)&buffer);
  return this_local;
}

Assistant:

UnicodeString &
UnicodeString::caseMap(int32_t caseLocale, uint32_t options, UCASEMAP_BREAK_ITERATOR_PARAM
                       UStringCaseMapper *stringCaseMapper) {
  if(isEmpty() || !isWritable()) {
    // nothing to do
    return *this;
  }

  UChar oldBuffer[2 * US_STACKBUF_SIZE];
  UChar *oldArray;
  int32_t oldLength = length();
  int32_t newLength;
  UBool writable = isBufferWritable();
  UErrorCode errorCode = U_ZERO_ERROR;

#if !UCONFIG_NO_BREAK_ITERATION
  // Read-only alias to the original string contents for the titlecasing BreakIterator.
  // We cannot set the iterator simply to *this because *this is being modified.
  UnicodeString oldString;
#endif

  // Try to avoid heap-allocating a new character array for this string.
  if (writable ? oldLength <= UPRV_LENGTHOF(oldBuffer) : oldLength < US_STACKBUF_SIZE) {
    // Short string: Copy the contents into a temporary buffer and
    // case-map back into the current array, or into the stack buffer.
    UChar *buffer = getArrayStart();
    int32_t capacity;
    oldArray = oldBuffer;
    u_memcpy(oldBuffer, buffer, oldLength);
    if (writable) {
      capacity = getCapacity();
    } else {
      // Switch from the read-only alias or shared heap buffer to the stack buffer.
      if (!cloneArrayIfNeeded(US_STACKBUF_SIZE, US_STACKBUF_SIZE, /* doCopyArray= */ FALSE)) {
        return *this;
      }
      U_ASSERT(fUnion.fFields.fLengthAndFlags & kUsingStackBuffer);
      buffer = fUnion.fStackFields.fBuffer;
      capacity = US_STACKBUF_SIZE;
    }
#if !UCONFIG_NO_BREAK_ITERATION
    if (iter != nullptr) {
      oldString.setTo(FALSE, oldArray, oldLength);
      iter->setText(oldString);
    }
#endif
    newLength = stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                                 buffer, capacity,
                                 oldArray, oldLength, NULL, errorCode);
    if (U_SUCCESS(errorCode)) {
      setLength(newLength);
      return *this;
    } else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      // common overflow handling below
    } else {
      setToBogus();
      return *this;
    }
  } else {
    // Longer string or read-only buffer:
    // Collect only changes and then apply them to this string.
    // Case mapping often changes only small parts of a string,
    // and often does not change its length.
    oldArray = getArrayStart();
    Edits edits;
    UChar replacementChars[200];
#if !UCONFIG_NO_BREAK_ITERATION
    if (iter != nullptr) {
      oldString.setTo(FALSE, oldArray, oldLength);
      iter->setText(oldString);
    }
#endif
    stringCaseMapper(caseLocale, options | U_OMIT_UNCHANGED_TEXT, UCASEMAP_BREAK_ITERATOR
                     replacementChars, UPRV_LENGTHOF(replacementChars),
                     oldArray, oldLength, &edits, errorCode);
    if (U_SUCCESS(errorCode)) {
      // Grow the buffer at most once, not for multiple doReplace() calls.
      newLength = oldLength + edits.lengthDelta();
      if (newLength > oldLength && !cloneArrayIfNeeded(newLength, newLength)) {
        return *this;
      }
      for (Edits::Iterator ei = edits.getCoarseChangesIterator(); ei.next(errorCode);) {
        doReplace(ei.destinationIndex(), ei.oldLength(),
                  replacementChars, ei.replacementIndex(), ei.newLength());
      }
      if (U_FAILURE(errorCode)) {
        setToBogus();
      }
      return *this;
    } else if (errorCode == U_BUFFER_OVERFLOW_ERROR) {
      // common overflow handling below
      newLength = oldLength + edits.lengthDelta();
    } else {
      setToBogus();
      return *this;
    }
  }

  // Handle buffer overflow, newLength is known.
  // We need to allocate a new buffer for the internal string case mapping function.
  // This is very similar to how doReplace() keeps the old array pointer
  // and deletes the old array itself after it is done.
  // In addition, we are forcing cloneArrayIfNeeded() to always allocate a new array.
  int32_t *bufferToDelete = 0;
  if (!cloneArrayIfNeeded(newLength, newLength, FALSE, &bufferToDelete, TRUE)) {
    return *this;
  }
  errorCode = U_ZERO_ERROR;
  // No need to iter->setText() again: The case mapper restarts via iter->first().
  newLength = stringCaseMapper(caseLocale, options, UCASEMAP_BREAK_ITERATOR
                               getArrayStart(), getCapacity(),
                               oldArray, oldLength, NULL, errorCode);
  if (bufferToDelete) {
    uprv_free(bufferToDelete);
  }
  if (U_SUCCESS(errorCode)) {
    setLength(newLength);
  } else {
    setToBogus();
  }
  return *this;
}